

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O0

void __thiscall
unodb::detail::
basic_inode_48<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
::dump(basic_inode_48<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
       *this,ostream *os,bool recursive)

{
  uchar uVar1;
  byte bVar2;
  bool bVar3;
  in_critical_section *piVar4;
  ostream *poVar5;
  const_reference pvVar6;
  basic_node_ptr<unodb::detail::olc_node_header> local_30;
  uint local_24;
  uint local_20;
  uint i;
  uint actual_children_count;
  uchar children_count_;
  bool recursive_local;
  ostream *os_local;
  basic_inode_48<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
  *this_local;
  
  i._3_1_ = recursive;
  _actual_children_count = os;
  os_local = (ostream *)this;
  basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
  ::dump((basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
          *)this,os,recursive);
  i._2_1_ = in_critical_section<unsigned_char>::load
                      ((in_critical_section<unsigned_char> *)&this->field_0x20);
  local_20 = 0;
  std::operator<<(_actual_children_count,", key bytes & child indexes\n");
  local_24 = 0;
  do {
    if (0xff < local_24) {
      if (local_20 != i._2_1_) {
        __assert_fail("actual_children_count == children_count_",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                      ,0x9c7,
                      "void unodb::detail::basic_inode_48<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::dump(std::ostream &, bool) const [ArtPolicy = unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
                     );
      }
      return;
    }
    piVar4 = (in_critical_section *)
             std::array<unodb::in_critical_section<unsigned_char>,_256UL>::operator[]
                       (&this->child_indexes,(ulong)local_24);
    uVar1 = in_critical_section::operator_cast_to_unsigned_char(piVar4);
    if (uVar1 != 0xff) {
      std::operator<<(_actual_children_count," ");
      dump_byte(_actual_children_count,(byte)local_24);
      poVar5 = std::operator<<(_actual_children_count,", child index = ");
      piVar4 = (in_critical_section *)
               std::array<unodb::in_critical_section<unsigned_char>,_256UL>::operator[]
                         (&this->child_indexes,(ulong)local_24);
      bVar2 = in_critical_section::operator_cast_to_unsigned_char(piVar4);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(uint)bVar2);
      std::operator<<(poVar5,": ");
      piVar4 = (in_critical_section *)
               std::array<unodb::in_critical_section<unsigned_char>,_256UL>::operator[]
                         (&this->child_indexes,(ulong)local_24);
      bVar2 = in_critical_section::operator_cast_to_unsigned_char(piVar4);
      pvVar6 = std::
               array<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>,_48UL>
               ::operator[](&(this->children).pointer_array,(ulong)bVar2);
      bVar3 = in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>::
              operator==(pvVar6,(nullptr_t)0x0);
      poVar5 = _actual_children_count;
      if (((bVar3 ^ 0xffU) & 1) == 0) {
        __assert_fail("children.pointer_array[child_indexes[i]] != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                      ,0x9bc,
                      "void unodb::detail::basic_inode_48<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::dump(std::ostream &, bool) const [ArtPolicy = unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
                     );
      }
      if ((i._3_1_ & 1) != 0) {
        piVar4 = (in_critical_section *)
                 std::array<unodb::in_critical_section<unsigned_char>,_256UL>::operator[]
                           (&this->child_indexes,(ulong)local_24);
        bVar2 = in_critical_section::operator_cast_to_unsigned_char(piVar4);
        pvVar6 = std::
                 array<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>,_48UL>
                 ::operator[](&(this->children).pointer_array,(ulong)bVar2);
        local_30 = in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                   ::load(pvVar6);
        basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>
        ::dump_node(poVar5,&local_30,true);
      }
      local_20 = local_20 + 1;
      if (i._2_1_ < local_20) {
        __assert_fail("actual_children_count <= children_count_",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                      ,0x9c3,
                      "void unodb::detail::basic_inode_48<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::dump(std::ostream &, bool) const [ArtPolicy = unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
                     );
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

[[gnu::cold]] UNODB_DETAIL_NOINLINE void dump(std::ostream &os,
                                                bool recursive) const {
    parent_class::dump(os, recursive);
#ifndef NDEBUG
    const auto children_count_ = this->children_count.load();
    unsigned actual_children_count = 0;
#endif

    os << ", key bytes & child indexes\n";
    for (unsigned i = 0; i < 256; i++)
      if (child_indexes[i] != empty_child) {
        os << " ";
        dump_byte(os, static_cast<std::byte>(i));
        os << ", child index = " << static_cast<unsigned>(child_indexes[i])
           << ": ";
        UNODB_DETAIL_ASSERT(children.pointer_array[child_indexes[i]] !=
                            nullptr);
        if (recursive) {
          ArtPolicy::dump_node(os,
                               children.pointer_array[child_indexes[i]].load());
        }
#ifndef NDEBUG
        ++actual_children_count;
        UNODB_DETAIL_ASSERT(actual_children_count <= children_count_);
#endif
      }

    UNODB_DETAIL_ASSERT(actual_children_count == children_count_);
  }